

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

BOOL __thiscall
Js::TypedArray<double,_false,_false>::DirectSetItemNoSet
          (TypedArray<double,_false,_false> *this,uint32 index,Var value)

{
  BOOL BVar1;
  Var value_local;
  uint32 index_local;
  TypedArray<double,_false,_false> *this_local;
  
  BVar1 = BaseTypedDirectSetItemNoSet(this,index,value,JavascriptConversion::ToNumber);
  return BVar1;
}

Assistant:

inline BOOL Float64Array::DirectSetItemNoSet(__in uint32 index, __in Js::Var value)
    {
        return BaseTypedDirectSetItemNoSet(index, value, JavascriptConversion::ToNumber);
    }